

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JlOutputJson.c
# Opt level: O2

JL_STATUS ProcessTheStack(ProcessStack *Stack,JlBuffer *JsonBuffer,JL_OUTPUT_FLAGS OutputFlags)

{
  uint32_t uVar1;
  JL_STATUS JVar2;
  ProcessStack *pPVar3;
  uint uVar4;
  uint32_t StackDepth;
  JL_OUTPUT_FLAGS extraout_RDX;
  JL_OUTPUT_FLAGS extraout_RDX_00;
  JL_OUTPUT_FLAGS extraout_RDX_01;
  JL_OUTPUT_FLAGS extraout_RDX_02;
  JL_OUTPUT_FLAGS extraout_RDX_03;
  JL_OUTPUT_FLAGS OutputFlags_00;
  uint32_t stackDepth;
  
  stackDepth = 1;
  JVar2 = JL_STATUS_SUCCESS;
  OutputFlags_00 = OutputFlags;
LAB_00102ac0:
  while( true ) {
    uVar1 = stackDepth;
    if ((stackDepth == 0) || (JVar2 != JL_STATUS_SUCCESS)) {
      return JVar2;
    }
    uVar4 = Stack[stackDepth].ObjectType - JL_DATA_TYPE_STRING;
    if (uVar4 < 5) break;
    JVar2 = JL_STATUS_SUCCESS;
  }
  pPVar3 = Stack + stackDepth;
  StackDepth = (&switchD_00102aed::switchdataD_001061ac)[uVar4] + 0x1061ac;
  switch(Stack[stackDepth].ObjectType) {
  case JL_DATA_TYPE_STRING:
    JVar2 = OutputStringObject(pPVar3->Object,JsonBuffer,OutputFlags,StackDepth);
    OutputFlags_00 = extraout_RDX;
    break;
  case JL_DATA_TYPE_NUMBER:
    JVar2 = OutputNumberObject(pPVar3->Object,JsonBuffer,OutputFlags,StackDepth);
    OutputFlags_00 = extraout_RDX_03;
    break;
  case JL_DATA_TYPE_BOOL:
    JVar2 = OutputBoolObject(pPVar3->Object,JsonBuffer,OutputFlags_00,StackDepth);
    OutputFlags_00 = extraout_RDX_01;
    break;
  case JL_DATA_TYPE_LIST:
    JVar2 = ProcessListOnStack(Stack,&stackDepth,JsonBuffer,OutputFlags);
    OutputFlags_00 = extraout_RDX_02;
    goto LAB_00102ac0;
  case JL_DATA_TYPE_DICTIONARY:
    goto switchD_00102aed_caseD_5;
  }
  stackDepth = uVar1 - 1;
  goto LAB_00102ac0;
switchD_00102aed_caseD_5:
  JVar2 = ProcessDictionaryOnStack(Stack,&stackDepth,JsonBuffer,OutputFlags);
  OutputFlags_00 = extraout_RDX_00;
  goto LAB_00102ac0;
}

Assistant:

JL_STATUS
    ProcessTheStack
    (
        ProcessStack*   Stack,
        JlBuffer*       JsonBuffer,
        JL_OUTPUT_FLAGS OutputFlags
    )
{
    JL_STATUS jlStatus;
    uint32_t stackDepth = 1;

    jlStatus = JL_STATUS_SUCCESS;

    while( stackDepth > 0  &&  JL_STATUS_SUCCESS == jlStatus )
    {
        // Process current deepest stack item
        ProcessStack* currentItem = &Stack[stackDepth];

        if( JL_DATA_TYPE_STRING == currentItem->ObjectType )
        {
            // String object. Output the string
            jlStatus = OutputStringObject( currentItem->Object, JsonBuffer, OutputFlags, stackDepth );
            stackDepth -= 1;
        }
        else if( JL_DATA_TYPE_NUMBER == currentItem->ObjectType )
        {
            // Number object. Output the number
            jlStatus = OutputNumberObject( currentItem->Object, JsonBuffer, OutputFlags, stackDepth );
            stackDepth -= 1;
        }
        else if( JL_DATA_TYPE_BOOL == currentItem->ObjectType )
        {
            // Boolean object. Output the boolean
            jlStatus = OutputBoolObject( currentItem->Object, JsonBuffer, OutputFlags, stackDepth );
            stackDepth -= 1;
        }
        else if( JL_DATA_TYPE_LIST == currentItem->ObjectType )
        {
            jlStatus = ProcessListOnStack( Stack, &stackDepth, JsonBuffer, OutputFlags );
        }
        else if( JL_DATA_TYPE_DICTIONARY == currentItem->ObjectType )
        {
            jlStatus = ProcessDictionaryOnStack( Stack, &stackDepth, JsonBuffer, OutputFlags );
        }

    }

    return jlStatus;
}